

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

void gen_trigrams(uint8_t *mem,uint64_t size,TrigramCallback *cb)

{
  undefined8 in_RAX;
  uint uVar1;
  uint64_t uVar2;
  undefined8 uStack_38;
  
  if (2 < size) {
    uVar1 = (uint)(ushort)(*(ushort *)mem << 8 | *(ushort *)mem >> 8);
    uVar2 = 2;
    uStack_38 = in_RAX;
    do {
      uVar1 = (uint)mem[uVar2] | (uVar1 & 0xffff) << 8;
      uStack_38 = CONCAT44(uVar1,(undefined4)uStack_38);
      if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*cb->_M_invoker)((_Any_data *)cb,(uint *)((long)&uStack_38 + 4));
      uVar2 = uVar2 + 1;
    } while (size != uVar2);
  }
  return;
}

Assistant:

void gen_trigrams(const uint8_t *mem, uint64_t size,
                  const TrigramCallback &cb) {
    if (size < 3) {
        return;
    }

    uint32_t gram3 = (mem[0] << 8U) | mem[1];

    for (uint64_t offset = 2; offset < size; offset++) {
        gram3 = ((gram3 & 0xFFFFU) << 8U) | mem[offset];
        cb(gram3);
    }
}